

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

void __thiscall yactfr::internal::PktProc::buildRawProcFromShared(PktProc *this)

{
  __node_base *p_Var1;
  
  Proc::buildRawProcFromShared(&this->_preambleProc);
  p_Var1 = &(this->_dsPktProcs)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    DsPktProc::buildRawProcFromShared
              (*(DsPktProc **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
  }
  return;
}

Assistant:

void PktProc::buildRawProcFromShared()
{
    _preambleProc.buildRawProcFromShared();

    for (const auto& idDsPktProcPair : _dsPktProcs) {
        idDsPktProcPair.second->buildRawProcFromShared();
    }
}